

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

void __thiscall Al::internal::ProgressEngine::enqueue(ProgressEngine *this,AlState *state)

{
  bool bVar1;
  ulong *puVar2;
  long lVar3;
  undefined8 uVar4;
  SPSCQueue<Al::internal::AlState_*> *in_RSI;
  long in_RDI;
  size_t locked_local_num_input_streams;
  size_t i;
  size_t local_num_input_streams;
  memory_order __b;
  undefined8 in_stack_ffffffffffffffa0;
  long lVar5;
  atomic<bool> *in_stack_ffffffffffffffa8;
  AlState **local_38;
  AlState **v;
  AlState **v_00;
  
  bVar1 = std::atomic<bool>::load
                    (in_stack_ffffffffffffffa8,
                     (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  if (!bVar1) {
    run((ProgressEngine *)i);
  }
  puVar2 = (ulong *)(in_RDI + 0x8080);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  v = (AlState **)*puVar2;
  local_38 = (AlState **)0x0;
  while( true ) {
    if (v <= local_38) {
      v_00 = v;
      uVar4 = (**(code **)(in_RSI->size + 0x20))();
      *(undefined8 *)(in_RDI + (long)v * 0x200 + 0x200) = uVar4;
      std::__atomic_base<unsigned_long>::operator++
                ((__atomic_base<unsigned_long> *)(in_RDI + 0x8080));
      SPSCQueue<Al::internal::AlState_*>::push(in_RSI,v_00);
      return;
    }
    lVar5 = *(long *)(in_RDI + (long)local_38 * 0x200 + 0x200);
    lVar3 = (**(code **)(in_RSI->size + 0x20))();
    if (lVar5 == lVar3) break;
    local_38 = (AlState **)((long)local_38 + 1);
  }
  SPSCQueue<Al::internal::AlState_*>::push(in_RSI,v);
  return;
}

Assistant:

void ProgressEngine::enqueue(AlState* state) {
#ifdef AL_PE_START_ON_DEMAND
  if (!started_flag.load()) {
    run();
  }
#endif
#ifdef AL_PE_STREAM_QUEUE_CACHE
  // Check the thread-local queue cache.
  auto iter = ProgressEngine::stream_to_queue.find(state->get_compute_stream());
  if (iter != ProgressEngine::stream_to_queue.end()) {
    iter->second->q.push(state);
    return;
  }
  const size_t local_num_input_streams = num_input_streams.load();
#else
  // Linear search to find the queue.
  const size_t local_num_input_streams = num_input_streams.load();
  for (size_t i = 0; i < local_num_input_streams; ++i) {
    if (request_queues[i].compute_stream == state->get_compute_stream()) {
      // Appropriate queue found, we can just enqueue.
      request_queues[i].q.push(state);
      return;
    }
  }
#endif
  // Queue was not found, so we need to create it.
#ifdef AL_THREAD_MULTIPLE
  add_queue_mutex.lock();
  // Check if some other thread added the queue.
  const size_t locked_local_num_input_streams = num_input_streams.load();
  for (size_t i = local_num_input_streams;
       i < locked_local_num_input_streams;
       ++i) {
    if (request_queues[i].compute_stream == state->get_compute_stream()) {
      // Queue was added.
      add_queue_mutex.unlock();
      request_queues[i].q.push(state);
#ifdef AL_PE_STREAM_QUEUE_CACHE
      // Update cache.
      ProgressEngine::stream_to_queue[state->get_compute_stream()] = &request_queues[i];
#endif
      return;
    }
  }
#else
  // When there is only one thread, if the queue was not found earlier,
  // we always have to create it.
  const size_t locked_local_num_input_streams = local_num_input_streams;
#endif
#ifdef AL_DEBUG
  // Ensure we do not try to use too many queues.
  if (locked_local_num_input_streams >= AL_PE_NUM_STREAMS) {
    throw_al_exception(
      "Trying to create more progress engine streams than supported");
  }
#endif
  // Add the new queue.
  request_queues[locked_local_num_input_streams].compute_stream = state->get_compute_stream();
  ++num_input_streams;  // Make new queue visible.
#ifdef AL_THREAD_MULTIPLE
  add_queue_mutex.unlock();
#endif
  request_queues[locked_local_num_input_streams].q.push(state);
#ifdef AL_PE_STREAM_QUEUE_CACHE
  ProgressEngine::stream_to_queue[state->get_compute_stream()] = &request_queues[locked_local_num_input_streams];
#endif
}